

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
MarshalAllPropertiesToScriptContext
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *this,
          DynamicObject *instance,ScriptContext *targetScriptContext,bool invalidateFixedFields)

{
  ushort uVar1;
  JavascriptString *propertyKey;
  int iVar2;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar3;
  ScriptContext *scriptContext_00;
  JavascriptString **ppJVar4;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor_00;
  Var pvVar5;
  int local_50;
  int slotIndex;
  int slotCount;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  JavascriptString *propertyRecord;
  int propertyIndex;
  ScriptContext *scriptContext;
  int propertyCount;
  bool invalidateFixedFields_local;
  ScriptContext *targetScriptContext_local;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *this_local;
  
  pBVar3 = Memory::
           WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
           ::operator->(&this->propertyMap);
  iVar2 = JsUtil::
          BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
          ::Count(pBVar3);
  if (invalidateFixedFields) {
    scriptContext_00 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
    for (propertyRecord._4_4_ = 0; propertyRecord._4_4_ < iVar2;
        propertyRecord._4_4_ = propertyRecord._4_4_ + 1) {
      pBVar3 = Memory::
               WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
               ::operator->(&this->propertyMap);
      ppJVar4 = JsUtil::
                BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                ::GetKeyAt(pBVar3,propertyRecord._4_4_);
      propertyKey = *ppJVar4;
      pBVar3 = Memory::
               WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
               ::operator->(&this->propertyMap);
      descriptor_00 =
           JsUtil::
           BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
           ::GetReferenceAt(pBVar3,propertyRecord._4_4_);
      SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false>::
      InvalidateFixedField<Js::JavascriptString*>
                ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false> *)this
                 ,propertyKey,descriptor_00,scriptContext_00);
    }
  }
  uVar1 = this->nextPropertyIndex;
  for (local_50 = 0; local_50 < (int)(uint)uVar1; local_50 = local_50 + 1) {
    pvVar5 = DynamicTypeHandler::GetSlot(&this->super_DynamicTypeHandler,instance,local_50);
    pvVar5 = CrossSite::MarshalVar(targetScriptContext,pvVar5,false);
    DynamicTypeHandler::SetSlotUnchecked(instance,local_50,pvVar5);
  }
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::MarshalAllPropertiesToScriptContext(DynamicObject* instance, ScriptContext* targetScriptContext, bool invalidateFixedFields)
    {
        // Note: This method is currently only called from ResetObject, which in turn only applies to external objects.
        // Before using for other purposes, make sure the assumptions made here make sense in the new context.  In particular,
        // the invalidateFixedFields == false is only correct if a) the object is known not to have any, or b) the type of the
        // object has changed and/or property guards have already been invalidated through some other means.
#if ENABLE_FIXED_FIELDS
        int propertyCount = this->propertyMap->Count();

        if (invalidateFixedFields)
        {
            ScriptContext* scriptContext = instance->GetScriptContext();
            for (int propertyIndex = 0; propertyIndex < propertyCount; propertyIndex++)
            {
                const TMapKey propertyRecord = this->propertyMap->GetKeyAt(propertyIndex);
                SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor = this->propertyMap->GetReferenceAt(propertyIndex);
                InvalidateFixedField(propertyRecord, descriptor, scriptContext);
            }
        }
#endif

        int slotCount = this->nextPropertyIndex;
        for (int slotIndex = 0; slotIndex < slotCount; slotIndex++)
        {
            SetSlotUnchecked(instance, slotIndex, CrossSite::MarshalVar(targetScriptContext, GetSlot(instance, slotIndex)));
        }
    }